

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetFrustumLine(ON_Viewport *this,double screenx,double screeny,ON_Line *world_line)

{
  double *this_00;
  bool bVar1;
  ON_3dPoint local_1b8;
  ON_3dPoint local_1a0;
  bool local_171;
  undefined1 auStack_170 [7];
  bool rc;
  ON_Line line;
  ON_3dPoint c;
  ON_Xform c2w;
  ON_Xform s2c;
  ON_Line *world_line_local;
  double screeny_local;
  double screenx_local;
  ON_Viewport *this_local;
  
  this_00 = c2w.m_xform[3] + 3;
  ON_Xform::ON_Xform((ON_Xform *)this_00);
  ON_Xform::ON_Xform((ON_Xform *)&c.z);
  ON_Line::ON_Line((ON_Line *)auStack_170);
  local_171 = GetXform(this,screen_cs,clip_cs,(ON_Xform *)this_00);
  if (local_171) {
    local_171 = GetXform(this,clip_cs,world_cs,(ON_Xform *)&c.z);
  }
  if (local_171 != false) {
    line.to.z = c2w.m_xform[3][3] * screenx + s2c.m_xform[0][0] * screeny + s2c.m_xform[0][2];
    c.x = s2c.m_xform[0][3] * screenx + s2c.m_xform[1][0] * screeny + s2c.m_xform[1][2];
    c.y = 1.0;
    ON_Xform::operator*(&local_1a0,(ON_Xform *)&c.z,(ON_3dPoint *)&line.to.z);
    line.to.y = local_1a0.z;
    line.from.z = local_1a0.x;
    line.to.x = local_1a0.y;
    c.y = -1.0;
    ON_Xform::operator*(&local_1b8,(ON_Xform *)&c.z,(ON_3dPoint *)&line.to.z);
    _auStack_170 = local_1b8.x;
    line.from.x = local_1b8.y;
    line.from.y = local_1b8.z;
    memcpy(world_line,auStack_170,0x30);
  }
  bVar1 = local_171;
  ON_Line::~ON_Line((ON_Line *)auStack_170);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Viewport::GetFrustumLine( double screenx, double screeny, ON_Line& world_line ) const
{
  ON_Xform s2c, c2w;
  ON_3dPoint c;
  ON_Line line;
  bool rc;

  rc = GetXform( ON::screen_cs, ON::clip_cs, s2c );
  if ( rc )
    rc = GetXform( ON::clip_cs, ON::world_cs, c2w );
  if (rc )
  {
    // c = mouse point on near clipping plane
    c.x = s2c.m_xform[0][0]*screenx + s2c.m_xform[0][1]*screeny + s2c.m_xform[0][3];
    c.y = s2c.m_xform[1][0]*screenx + s2c.m_xform[1][1]*screeny + s2c.m_xform[1][3];
    c.z = 1.0;
    line.to = c2w*c;   // line.to = near plane mouse point in world coords
    c.z = -1.0;
    line.from = c2w*c; // line.from = far plane mouse point in world coords

    world_line = line;
  }
  return rc;
}